

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

int mfclose(mFILE *mf)

{
  mFILE *mf_local;
  
  if (mf == (mFILE *)0x0) {
    mf_local._4_4_ = -1;
  }
  else {
    mfflush(mf);
    if (mf->fp != (FILE *)0x0) {
      fclose((FILE *)mf->fp);
    }
    mfdestroy(mf);
    mf_local._4_4_ = 0;
  }
  return mf_local._4_4_;
}

Assistant:

int mfclose(mFILE *mf) {
    if (!mf)
	return -1;

    mfflush(mf);

    if (mf->fp)
	fclose(mf->fp);

    mfdestroy(mf);

    return 0;
}